

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O1

void __thiscall udpdiscovery::impl::MinimalisticThread::Join(MinimalisticThread *this)

{
  if (this->detached_ == false) {
    pthread_join(this->thread_,(void **)0x0);
    this->detached_ = true;
  }
  return;
}

Assistant:

void Join() {
    if (detached_) return;

#if defined(_WIN32)
    WaitForSingleObject(thread_, INFINITE);
    CloseHandle(thread_);
#else
    pthread_join(thread_, 0);
#endif
    detached_ = true;
  }